

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitStringIterNext
          (WasmBinaryBuilder *this,Expression **out,uint32_t code)

{
  StringIterNext *pSVar1;
  Builder local_38;
  Expression *local_30;
  Expression *ref;
  Expression **ppEStack_20;
  uint32_t code_local;
  Expression **out_local;
  WasmBinaryBuilder *this_local;
  
  if (code == 0xa1) {
    ref._4_4_ = code;
    ppEStack_20 = out;
    out_local = (Expression **)this;
    local_30 = popNonVoidExpression(this);
    Builder::Builder(&local_38,this->wasm);
    pSVar1 = Builder::makeStringIterNext(&local_38,local_30);
    *ppEStack_20 = (Expression *)pSVar1;
  }
  return code == 0xa1;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitStringIterNext(Expression*& out,
                                                 uint32_t code) {
  if (code != BinaryConsts::StringViewIterNext) {
    return false;
  }
  auto* ref = popNonVoidExpression();
  out = Builder(wasm).makeStringIterNext(ref);
  return true;
}